

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O1

TestCaseResultPtr __thiscall xe::BatchResult::getTestCaseResult(BatchResult *this,char *casePath)

{
  int *piVar1;
  long lVar2;
  SharedPtrStateBase *pSVar3;
  size_type sVar4;
  iterator iVar5;
  long lVar6;
  char *in_RDX;
  TestCaseResultPtr TVar7;
  allocator<char> local_39;
  key_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,in_RDX,&local_39);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  *)(casePath + 0xf8),&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  lVar2 = *(long *)(casePath + 0xe0);
  lVar6 = (long)(int)iVar5._M_node[2]._M_color * 0x10;
  pSVar3 = *(SharedPtrStateBase **)(lVar2 + lVar6);
  (this->m_sessionInfo).releaseName._M_dataplus._M_p = (pointer)pSVar3;
  sVar4 = *(size_type *)(lVar2 + 8 + lVar6);
  (this->m_sessionInfo).releaseName._M_string_length = sVar4;
  if (sVar4 != 0) {
    LOCK();
    *(int *)(sVar4 + 8) = *(int *)(sVar4 + 8) + 1;
    UNLOCK();
    LOCK();
    piVar1 = (int *)((this->m_sessionInfo).releaseName._M_string_length + 0xc);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  TVar7.m_state = pSVar3;
  TVar7.m_ptr = (TestCaseResultData *)this;
  return TVar7;
}

Assistant:

TestCaseResultPtr BatchResult::getTestCaseResult (const char* casePath)
{
	map<string, int>::const_iterator pos = m_resultMap.find(casePath);
	DE_ASSERT(pos != m_resultMap.end());
	return getTestCaseResult(pos->second);
}